

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::str_writer<char>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          str_writer<char> *f)

{
  undefined8 *puVar1;
  long lVar2;
  byte bVar3;
  size_t size;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  fill_t<wchar_t> *fill;
  ulong uVar7;
  long lVar8;
  wchar_t *pwVar9;
  ulong uVar10;
  ulong uVar11;
  size_t n;
  
  uVar11 = (ulong)(uint)specs->width;
  uVar10 = f->size_;
  uVar4 = uVar10;
  if (uVar11 != 0) {
    if (uVar10 == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      uVar7 = 0;
      do {
        uVar4 = uVar4 + 1;
        uVar7 = uVar7 + 1;
      } while (uVar10 != uVar7);
    }
  }
  n = uVar11 - uVar4;
  if (uVar4 <= uVar11 && n != 0) {
    puVar1 = *(undefined8 **)this;
    lVar8 = puVar1[2];
    uVar10 = (specs->fill).size_ * n + uVar10 + lVar8;
    if ((ulong)puVar1[3] < uVar10) {
      (**(code **)*puVar1)(puVar1,uVar10);
    }
    puVar1[2] = uVar10;
    pwVar9 = (wchar_t *)(lVar8 * 4 + puVar1[1]);
    fill = &specs->fill;
    bVar3 = specs->field_0x9 & 0xf;
    if (bVar3 == 3) {
      pwVar9 = fill<wchar_t*,wchar_t>(pwVar9,n >> 1,fill);
      if (0 < (long)f->size_) {
        pcVar5 = f->s;
        uVar10 = f->size_ + 1;
        do {
          *pwVar9 = (int)*pcVar5;
          pcVar5 = pcVar5 + 1;
          pwVar9 = pwVar9 + 1;
          uVar10 = uVar10 - 1;
        } while (1 < uVar10);
      }
      n = n - (n >> 1);
    }
    else {
      if (bVar3 == 2) {
        pwVar9 = fill<wchar_t*,wchar_t>(pwVar9,n,fill);
        if ((long)f->size_ < 1) {
          return;
        }
        pcVar5 = f->s;
        uVar10 = f->size_ + 1;
        lVar8 = 0;
        do {
          pwVar9[lVar8] = (int)pcVar5[lVar8];
          uVar10 = uVar10 - 1;
          lVar8 = lVar8 + 1;
        } while (1 < uVar10);
        return;
      }
      if (0 < (long)f->size_) {
        pcVar5 = f->s;
        uVar10 = f->size_ + 1;
        do {
          *pwVar9 = (int)*pcVar5;
          pcVar5 = pcVar5 + 1;
          pwVar9 = pwVar9 + 1;
          uVar10 = uVar10 - 1;
        } while (1 < uVar10);
      }
    }
    fill<wchar_t*,wchar_t>(pwVar9,n,fill);
    return;
  }
  puVar1 = *(undefined8 **)this;
  lVar8 = puVar1[2];
  uVar4 = lVar8 + uVar10;
  if ((ulong)puVar1[3] < uVar4) {
    (**(code **)*puVar1)(puVar1,uVar4);
    uVar10 = f->size_;
  }
  puVar1[2] = uVar4;
  if (0 < (long)uVar10) {
    lVar2 = puVar1[1];
    pcVar5 = f->s;
    uVar10 = uVar10 + 1;
    lVar6 = 0;
    do {
      *(int *)(lVar8 * 4 + lVar2 + lVar6 * 4) = (int)pcVar5[lVar6];
      uVar10 = uVar10 - 1;
      lVar6 = lVar6 + 1;
    } while (1 < uVar10);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }